

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

VdbeOp * sqlite3VdbeAddOpList(Vdbe *p,int nOp,VdbeOpList *aOp,int iLineno)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  VdbeOp *pVVar4;
  long lVar5;
  VdbeOp *pVVar6;
  
  iVar3 = p->nOp;
  if (p->nOpAlloc < iVar3 + nOp) {
    iVar3 = growOpArray(p,nOp);
    if (iVar3 != 0) {
      return (VdbeOp *)0x0;
    }
    iVar3 = p->nOp;
  }
  pVVar4 = p->aOp + iVar3;
  lVar5 = 0;
  pVVar6 = pVVar4;
  iVar3 = 0;
  if (0 < nOp) {
    iVar3 = nOp;
  }
  for (; iVar3 != (int)lVar5; lVar5 = lVar5 + 1) {
    bVar1 = aOp[lVar5].opcode;
    pVVar6->opcode = bVar1;
    pVVar6->p1 = (int)aOp[lVar5].p1;
    cVar2 = aOp[lVar5].p2;
    pVVar6->p2 = (int)cVar2;
    if (((""[bVar1] & 1) != 0) && ('\0' < cVar2)) {
      pVVar6->p2 = (int)cVar2 + p->nOp;
    }
    pVVar6->p3 = (int)aOp[lVar5].p3;
    pVVar6->p4type = '\0';
    (pVVar6->p4).p = (void *)0x0;
    pVVar6->p5 = 0;
    pVVar6 = pVVar6 + 1;
  }
  p->nOp = p->nOp + nOp;
  return pVVar4;
}

Assistant:

SQLITE_PRIVATE VdbeOp *sqlite3VdbeAddOpList(
  Vdbe *p,                     /* Add opcodes to the prepared statement */
  int nOp,                     /* Number of opcodes to add */
  VdbeOpList const *aOp,       /* The opcodes to be added */
  int iLineno                  /* Source-file line number of first opcode */
){
  int i;
  VdbeOp *pOut, *pFirst;
  assert( nOp>0 );
  assert( p->magic==VDBE_MAGIC_INIT );
  if( p->nOp + nOp > p->nOpAlloc && growOpArray(p, nOp) ){
    return 0;
  }
  pFirst = pOut = &p->aOp[p->nOp];
  for(i=0; i<nOp; i++, aOp++, pOut++){
    pOut->opcode = aOp->opcode;
    pOut->p1 = aOp->p1;
    pOut->p2 = aOp->p2;
    assert( aOp->p2>=0 );
    if( (sqlite3OpcodeProperty[aOp->opcode] & OPFLG_JUMP)!=0 && aOp->p2>0 ){
      pOut->p2 += p->nOp;
    }
    pOut->p3 = aOp->p3;
    pOut->p4type = P4_NOTUSED;
    pOut->p4.p = 0;
    pOut->p5 = 0;
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
    pOut->zComment = 0;
#endif
#ifdef SQLITE_VDBE_COVERAGE
    pOut->iSrcLine = iLineno+i;
#else
    (void)iLineno;
#endif
#ifdef SQLITE_DEBUG
    if( p->db->flags & SQLITE_VdbeAddopTrace ){
      sqlite3VdbePrintOp(0, i+p->nOp, &p->aOp[i+p->nOp]);
    }
#endif
  }
  p->nOp += nOp;
  return pFirst;
}